

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O0

void deqp::gles2::Functional::eval_mul_ivec4(ShaderEvalContext *c)

{
  Vector<float,_4> local_70;
  Vector<float,_4> local_60;
  Vector<float,_4> local_50;
  Vector<float,_4> local_40;
  tcu local_30 [16];
  Vector<int,_4> local_20;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  tcu::Vector<float,_4>::swizzle(&local_50,(int)c + 0x30,1,2,3);
  tcu::Vector<float,_4>::asInt(&local_40);
  tcu::Vector<float,_4>::swizzle(&local_70,(int)local_10 + 0x40,3,2,1);
  tcu::Vector<float,_4>::asInt(&local_60);
  tcu::mul<int,4>(local_30,(Vector<int,_4> *)&local_40,(Vector<int,_4> *)&local_60);
  tcu::Vector<int,_4>::asFloat(&local_20);
  *(undefined8 *)(local_10->color).m_data = local_20.m_data._0_8_;
  *(undefined8 *)((local_10->color).m_data + 2) = local_20.m_data._8_8_;
  return;
}

Assistant:

void eval_selection_int		(ShaderEvalContext& c) { c.color.x()	= (float)selection(c.in[0].z() > 0.0f,	(int)c.in[1].x(),						(int)c.in[2].y()); }